

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O3

void __thiscall
ClCommandLine_DoubleDashStringOptionWithSingleDash_Test::TestBody
          (ClCommandLine_DoubleDashStringOptionWithSingleDash_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  string_stream output;
  opt<bool,_pstore::command_line::parser<bool,_void>_> option;
  string_stream errors;
  string local_430;
  AssertHelper local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  AssertHelper local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  undefined1 local_3f0 [24];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  string local_398 [3];
  ios_base local_328 [264];
  opt<bool,_pstore::command_line::parser<bool,_void>_> local_220;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::opt<char[4]>
            (&local_220,(char (*) [4])0x17cacd);
  local_398[0]._M_dataplus._M_p = (pointer)&local_398[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"progname","");
  (anonymous_namespace)::ClCommandLine::add<char_const*>((ClCommandLine *)this,local_398,"-arg");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398[0]._M_dataplus._M_p != &local_398[0].field_2) {
    operator_delete(local_398[0]._M_dataplus._M_p,local_398[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar2 = anon_unknown.dwarf_26bb7::ClCommandLine::parse_command_line_options
                    (&this->super_ClCommandLine,(string_stream *)local_398,
                     (string_stream *)local_190);
  local_400.data_._0_1_ = (internal)!bVar2;
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_430,(internal *)&local_400,(AssertionResult *)0x184050,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_3f0 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xa8,local_430._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_3f0 + 0x10),(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_3f0 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if (local_410.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_410.data_ + 8))();
    }
    if (local_3f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3f8,local_3f8);
    }
  }
  testing::HasSubstr<char[30]>(&local_3b8,(StringLike<char[30]> *)"Unknown command line argument");
  paVar1 = &local_430.field_2;
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,local_3b8.impl_.substring_._M_dataplus._M_p,
             local_3b8.impl_.substring_._M_dataplus._M_p +
             local_3b8.impl_.substring_._M_string_length);
  local_400.data_ = (AssertHelperData *)local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_430._M_dataplus._M_p,
             (long)(Type *)local_430._M_string_length + local_430._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_410,(char *)&local_400,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_400.data_ != (AssertHelperData *)local_3f0) {
    operator_delete(local_400.data_,local_3f0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.impl_.substring_._M_dataplus._M_p != &local_3b8.impl_.substring_.field_2) {
    operator_delete(local_3b8.impl_.substring_._M_dataplus._M_p,
                    local_3b8.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_410.data_ == '\0') {
    testing::Message::Message((Message *)&local_430);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_430._M_dataplus._M_p + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  testing::HasSubstr<char[8]>(&local_3d8,(StringLike<char[8]> *)"\'--arg\'");
  local_430._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,local_3d8.impl_.substring_._M_dataplus._M_p,
             local_3d8.impl_.substring_._M_dataplus._M_p +
             local_3d8.impl_.substring_._M_string_length);
  local_400.data_ = (AssertHelperData *)local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_430._M_dataplus._M_p,
             (long)(Type *)local_430._M_string_length + local_430._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_410,(char *)&local_400,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_400.data_ != (AssertHelperData *)local_3f0) {
    operator_delete(local_400.data_,local_3f0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.impl_.substring_._M_dataplus._M_p != &local_3d8.impl_.substring_.field_2) {
    operator_delete(local_3d8.impl_.substring_._M_dataplus._M_p,
                    local_3d8.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_410.data_ == '\0') {
    testing::Message::Message((Message *)&local_430);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xab,pcVar3);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_430._M_dataplus._M_p + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringbuf::str();
  local_410.data_ = (AssertHelperData *)local_430._M_string_length;
  local_3f0._16_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_400,"output.str ().length ()","0U",(unsigned_long *)&local_410,
             (uint *)(local_3f0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_400.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_430);
    if (local_3f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_3f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_430._M_dataplus._M_p + 8))();
    }
  }
  if (local_3f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f8,local_3f8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
  std::ios_base::~ios_base(local_328);
  pstore::command_line::option::~option(&local_220.super_option);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashStringOptionWithSingleDash) {
    opt<bool> option ("arg");
    this->add ("progname", "-arg");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_THAT (errors.str (), testing::HasSubstr (PSTORE_NATIVE_TEXT ("'--arg'")));
    EXPECT_EQ (output.str ().length (), 0U);
}